

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstar.cpp
# Opt level: O2

void __thiscall GMAA_MAAstar::NewPPI(GMAA_MAAstar *this)

{
  PJPDP_sharedPtr *in_RSI;
  double in_XMM0_Qa;
  
  NewPPI(this,in_RSI,in_XMM0_Qa);
  return;
}

Assistant:

PartialPolicyPoolItemInterface_sharedPtr
GMAA_MAAstar::NewPPI(const PJPDP_sharedPtr &jp,
                     double v) const
{
    //NOTE: this conversion to an index does save a lot of space, so
    //if we can enable this again would be better.
    //PartialPolicyPoolItemInterface* ppi=new JPPVIndexValPair(jp,v);
    //delete jp;
    PartialPolicyPoolItemInterface_sharedPtr ppi=
        PartialPolicyPoolItemInterface_sharedPtr(new PartialJPDPValuePair(jp,v));
    return (ppi);
}